

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O1

void __thiscall
trimesh::dataset_t::
get_mfold<(trimesh::eGDIR)1,boost::range_detail::transformed_range<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,std::vector<int,std::allocator<int>>>>
          (dataset_t *this,mfold_t *mfold,
          transformed_range<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::vector<int,_std::allocator<int>_>_>
          *rng)

{
  tri_cc_t *ptVar1;
  iterator __position;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> arg;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  cellid_t *pcVar6;
  ostream *poVar7;
  runtime_error *this_00;
  long lVar8;
  cellid_t c;
  remove_cv_ref_t<decltype(boost::begin(rng))> b;
  stack<int,_std::deque<int,_std::allocator<int>_>_> stk;
  remove_cv_ref_t<decltype(boost::end(rng))> e;
  type tmp;
  cellid_t f [20];
  cellid_t local_2ec;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2e8;
  default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
  local_2e0 [8];
  type local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  shared_count local_2c0;
  _Deque_base<int,_std::allocator<int>_> local_2b8;
  int *local_260;
  char local_258;
  type local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  shared_count local_238;
  string local_230 [32];
  int *local_210;
  default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
  local_208 [8];
  type local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  shared_count local_1e8 [44];
  int local_88 [22];
  
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last = (int *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first = (int *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_2b8,0);
  local_2e8._M_current =
       (rng->
       super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
       ).
       super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
       .
       super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.super_type.m_iterator._M_current;
  local_2e0[0] = (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
                  )0x0;
  if ((rng->
      super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
      ).
      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.m_f.m_impl.super_type.m_initialized == true) {
    local_2d8 = (((storage_type *)
                 ((long)&(rng->
                         super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                         ).
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                         .
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                         .
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                         .m_Begin.m_f.m_impl + 8))->dummy_).aligner_;
    uStack_2d0 = *(undefined8 *)
                  ((long)&(rng->
                          super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                          ).
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                          .m_Begin.m_f.m_impl + 0x10);
    local_2c8 = *(undefined8 *)
                 ((long)&(rng->
                         super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                         ).
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                         .
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                         .
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                         .m_Begin.m_f.m_impl + 0x18);
    local_2c0.pi_ =
         *(sp_counted_base **)
          ((long)&(rng->
                  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                  ).
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                  .
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                  .
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                  .m_Begin.m_f.m_impl + 0x20);
    if (local_2c0.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_2c0.pi_)->use_count_ = (local_2c0.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_2e0[0] = (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
                    )0x1;
  }
  local_260 = (rng->
              super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
              ).
              super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
              .
              super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
              .m_End.super_type.m_iterator._M_current;
  local_258 = '\0';
  if ((rng->
      super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
      ).
      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
      .m_End.m_f.m_impl.super_type.m_initialized == true) {
    local_250 = (((storage_type *)
                 ((long)&(rng->
                         super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                         ).
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                         .
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                         .
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                         .m_End.m_f.m_impl + 8))->dummy_).aligner_;
    uStack_248 = *(undefined8 *)
                  ((long)&(rng->
                          super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                          ).
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                          .m_End.m_f.m_impl + 0x10);
    local_240 = *(undefined8 *)
                 ((long)&(rng->
                         super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                         ).
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                         .
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                         .
                         super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                         .m_End.m_f.m_impl + 0x18);
    local_238.pi_ =
         *(sp_counted_base **)
          ((long)&(rng->
                  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                  ).
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                  .
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                  .
                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                  .m_End.m_f.m_impl + 0x20);
    if (local_238.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_238.pi_)->use_count_ = (local_238.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_258 = '\x01';
  }
  iVar2 = boost::range_detail::
          default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
          ::operator()(local_2e0,local_2e8._M_current);
  ptVar1 = (this->m_tcc).px;
  if (ptVar1 != (tri_cc_t *)0x0) {
    uVar3 = tri_cc_t::get_cell_dim(ptVar1,iVar2);
    if (local_2e8._M_current != local_260) {
      do {
        arg._M_current = local_2e8._M_current;
        local_210 = local_2e8._M_current;
        local_208[0] = (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
                        )0x0;
        if (local_2e0[0] ==
            (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
             )0x1) {
          local_200 = local_2d8;
          uStack_1f8 = uStack_2d0;
          local_1f0 = local_2c8;
          local_1e8[0].pi_ = local_2c0.pi_;
          if (local_2c0.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (local_2c0.pi_)->use_count_ = (local_2c0.pi_)->use_count_ + 1;
            UNLOCK();
          }
          local_208[0] = (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
                          )0x1;
        }
        local_2e8._M_current = local_2e8._M_current + 1;
        local_88[0] = boost::range_detail::
                      default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
                      ::operator()(local_208,arg._M_current);
        if (local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>
                    ((deque<int,_std::allocator<int>_> *)&local_2b8,local_88);
        }
        else {
          *local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_88[0];
          local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        if (local_208[0] ==
            (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
             )0x1) {
          boost::detail::shared_count::~shared_count(local_1e8);
          local_208[0] = (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
                          )0x0;
        }
      } while (local_2e8._M_current != local_260);
    }
    if (local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        if (local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          local_2ec = local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f];
          operator_delete(local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
          local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
          local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_2ec = local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
          local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        ptVar1 = (this->m_tcc).px;
        if (ptVar1 == (tri_cc_t *)0x0) goto LAB_00167a54;
        uVar4 = tri_cc_t::get_cell_dim(ptVar1,local_2ec);
        if (uVar4 != uVar3) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_210);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_200,"Failed to assert condition ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_200,"cell_dim(c) == dim",0x12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"at (",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_200,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,",",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"get_mfold",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,",",1);
          poVar7 = (ostream *)std::ostream::operator<<(&local_200,0xca);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") \n ",4);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(this_00,local_230);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __position._M_current =
             (mfold->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (mfold->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)mfold,__position,&local_2ec);
        }
        else {
          *__position._M_current = local_2ec;
          (mfold->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        ptVar1 = (this->m_tcc).px;
        if (ptVar1 == (tri_cc_t *)0x0) goto LAB_00167a54;
        uVar4 = tri_cc_t::get_cell_co_facets(ptVar1,local_2ec,local_88);
        if (uVar4 != 0) {
          lVar8 = 0;
          do {
            if ((this->m_cell_pairs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[*(int *)((long)local_88 + lVar8)] != invalid_cellid
               ) {
              pcVar6 = pair(this,*(int *)((long)local_88 + lVar8));
              iVar2 = *pcVar6;
              local_210 = (int *)CONCAT44(local_210._4_4_,iVar2);
              if (iVar2 != local_2ec) {
                ptVar1 = (this->m_tcc).px;
                if (ptVar1 == (tri_cc_t *)0x0) goto LAB_00167a54;
                uVar5 = tri_cc_t::get_cell_dim(ptVar1,iVar2);
                if (uVar5 == uVar3) {
                  if (local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                              ((deque<int,std::allocator<int>> *)&local_2b8,(int *)&local_210);
                  }
                  else {
                    *local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int)local_210;
                    local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                }
              }
            }
            lVar8 = lVar8 + 4;
          } while ((ulong)uVar4 << 2 != lVar8);
        }
      } while (local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    if (local_258 == '\x01') {
      boost::detail::shared_count::~shared_count(&local_238);
      local_258 = '\0';
    }
    if (local_2e0[0] ==
        (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
         )0x1) {
      boost::detail::shared_count::~shared_count(&local_2c0);
      local_2e0[0] = (default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,int>
                      )0x0;
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_2b8);
    return;
  }
LAB_00167a54:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<tri_cc_t>::operator->() const [T = tri_cc_t]"
               );
}

Assistant:

inline void dataset_t::get_mfold(mfold_t &mfold,rng_t rng)
  {
    std::stack<cellid_t> stk;

    BOOST_AUTO(b,boost::begin(rng));
    BOOST_AUTO(e,boost::end(rng));

    int dim = cell_dim(*b);

    while ( b!= e) stk.push(*b++);

    cellid_t f[20],*fe,*fb;

    while(!stk.empty())
    {
      cellid_t c = stk.top(); stk.pop();

      ASSERT(cell_dim(c) == dim);

      mfold.push_back(c);

      fb = f; fe = f + get_cets<dir>(c,f);

      for (; fb != fe; ++fb )
        if( is_paired(*fb))
        {
          cellid_t p = pair(*fb);
          if(p != c && cell_dim(p) == dim)
            stk.push(p);
        }
    }
  }